

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

xmlDictPtr xmlDictCreateSub(xmlDictPtr sub)

{
  xmlDictPtr pxVar1;
  xmlDictPtr dict;
  xmlDictPtr sub_local;
  
  pxVar1 = xmlDictCreate();
  if ((pxVar1 != (xmlDictPtr)0x0) && (sub != (xmlDictPtr)0x0)) {
    pxVar1->seed = sub->seed;
    pxVar1->subdict = sub;
    xmlDictReference(pxVar1->subdict);
  }
  return pxVar1;
}

Assistant:

xmlDictPtr
xmlDictCreateSub(xmlDictPtr sub) {
    xmlDictPtr dict = xmlDictCreate();

    if ((dict != NULL) && (sub != NULL)) {
#ifdef DICT_DEBUG_PATTERNS
        fprintf(stderr, "R");
#endif
        dict->seed = sub->seed;
        dict->subdict = sub;
	xmlDictReference(dict->subdict);
    }
    return(dict);
}